

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O2

void Io_WriteHie(Abc_Ntk_t *pNtk,char *pBaseName,char *pFileName)

{
  uint uVar1;
  Io_FileType_t IVar2;
  Abc_Ntk_t *pAVar3;
  Abc_Ntk_t *pAVar4;
  Abc_Ntk_t *pAVar5;
  Abc_Des_t *pAVar6;
  FILE *__s;
  int iVar7;
  char *pcVar8;
  size_t sStack_40;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    pcVar8 = "Empty network.\n";
    sStack_40 = 0xf;
    __s = _stdout;
LAB_002e02ee:
    fwrite(pcVar8,sStack_40,1,__s);
    return;
  }
  if ((pNtk->ntkType & ~ABC_NTK_NETLIST) != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioUtil.c"
                  ,0x1ef,"void Io_WriteHie(Abc_Ntk_t *, char *, char *)");
  }
  IVar2 = Io_ReadFileType(pBaseName);
  if (IVar2 == IO_FILE_BLIF) {
    iVar7 = 0;
LAB_002e031a:
    pAVar3 = Io_ReadBlifMv(pBaseName,iVar7,1);
  }
  else {
    IVar2 = Io_ReadFileType(pBaseName);
    if (IVar2 == IO_FILE_BLIFMV) {
      iVar7 = 1;
      goto LAB_002e031a;
    }
    IVar2 = Io_ReadFileType(pBaseName);
    if (IVar2 != IO_FILE_VERILOG) {
      pcVar8 = "Unknown input file format.\n";
      sStack_40 = 0x1b;
      __s = _stderr;
      goto LAB_002e02ee;
    }
    pAVar3 = Io_ReadVerilog(pBaseName,1);
  }
  if (pAVar3 == (Abc_Ntk_t *)0x0) {
    return;
  }
  pAVar4 = pAVar3;
  if ((0 < pAVar3->nObjCounts[9]) && (pNtk->nBarBufs == 0)) {
    pAVar4 = Abc_NtkFlattenLogicHierarchy(pAVar3);
    Abc_NtkDelete(pAVar3);
    if (pAVar4 == (Abc_Ntk_t *)0x0) {
      return;
    }
  }
  if (pNtk->nBarBufs < 1) {
    IVar2 = Io_ReadFileType(pBaseName);
    if (IVar2 == IO_FILE_BLIFMV) {
      pAVar3 = pAVar4;
      if (0 < pAVar4->nObjCounts[10]) {
        puts("Hierarchy writer does not support BLIF-MV with blackboxes.");
        goto LAB_002e05ca;
      }
      if (pNtk->ntkType == ABC_NTK_NETLIST) {
        __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioUtil.c"
                      ,0x217,"void Io_WriteHie(Abc_Ntk_t *, char *, char *)");
      }
      pAVar5 = Abc_NtkToNetlist(pNtk);
      iVar7 = Abc_NtkConvertToBlifMv(pAVar5);
      if (iVar7 == 0) goto LAB_002e05ca;
      pAVar3 = Abc_NtkInsertBlifMv(pAVar4,pAVar5);
      Abc_NtkDelete(pAVar5);
    }
    else {
      if (0 < pAVar4->nObjCounts[10]) {
        pAVar5 = Abc_NtkToNetlist(pNtk);
        pAVar3 = Abc_NtkInsertNewLogic(pAVar4,pAVar5);
        Abc_NtkDelete(pAVar5);
        if (pAVar3 == (Abc_Ntk_t *)0x0) goto LAB_002e0433;
        uVar1 = pAVar4->nObjCounts[10];
        pcVar8 = "Hierarchy writer reintroduced %d instances of blackboxes.\n";
        goto LAB_002e03c1;
      }
      puts("Warning: The output network does not contain blackboxes.");
      pAVar3 = Abc_NtkToNetlist(pNtk);
    }
  }
  else {
    pAVar5 = Abc_NtkToNetlist(pNtk);
    pAVar3 = Abc_NtkFromBarBufs(pAVar4,pAVar5);
    Abc_NtkDelete(pAVar5);
    if (pAVar3 == (Abc_Ntk_t *)0x0) {
LAB_002e0433:
      pAVar3 = (Abc_Ntk_t *)0x0;
    }
    else {
      uVar1 = pNtk->nBarBufs;
      pcVar8 = "Hierarchy writer replaced %d barbufs by hierarchy boundaries.\n";
LAB_002e03c1:
      printf(pcVar8,(ulong)uVar1);
    }
  }
  Abc_NtkDelete(pAVar4);
  if (pAVar3 == (Abc_Ntk_t *)0x0) {
    return;
  }
  IVar2 = Io_ReadFileType(pFileName);
  if (IVar2 == IO_FILE_BLIF) {
    pAVar6 = pAVar3->pDesign;
    if (pAVar6 == (Abc_Des_t *)0x0) {
      if ((pAVar3->ntkFunc != ABC_FUNC_SOP) && (pAVar3->ntkFunc != ABC_FUNC_MAP)) {
        Abc_NtkToSop(pAVar3,-1,1000000000);
      }
    }
    else {
      for (iVar7 = 0; iVar7 < pAVar6->vModules->nSize; iVar7 = iVar7 + 1) {
        pAVar4 = (Abc_Ntk_t *)Vec_PtrEntry(pAVar6->vModules,iVar7);
        if ((pAVar4->ntkFunc != ABC_FUNC_SOP) && (pAVar4->ntkFunc != ABC_FUNC_MAP)) {
          Abc_NtkToSop(pAVar4,-1,1000000000);
        }
        pAVar6 = pAVar3->pDesign;
      }
    }
    Io_WriteBlif(pAVar3,pFileName,1,0,0);
  }
  else {
    IVar2 = Io_ReadFileType(pFileName);
    if (IVar2 == IO_FILE_VERILOG) {
      pAVar6 = pAVar3->pDesign;
      if (pAVar6 == (Abc_Des_t *)0x0) {
        if (1 < pAVar3->ntkFunc - ABC_FUNC_AIG) {
          Abc_NtkToAig(pAVar3);
        }
      }
      else {
        for (iVar7 = 0; iVar7 < pAVar6->vModules->nSize; iVar7 = iVar7 + 1) {
          pAVar4 = (Abc_Ntk_t *)Vec_PtrEntry(pAVar6->vModules,iVar7);
          if (1 < pAVar4->ntkFunc - ABC_FUNC_AIG) {
            Abc_NtkToAig(pAVar4);
          }
          pAVar6 = pAVar3->pDesign;
        }
      }
      Io_WriteVerilog(pAVar3,pFileName,0);
    }
    else {
      IVar2 = Io_ReadFileType(pFileName);
      if (IVar2 == IO_FILE_BLIFMV) {
        Io_WriteBlifMv(pAVar3,pFileName);
      }
      else {
        fwrite("Unknown output file format.\n",0x1c,1,_stderr);
      }
    }
  }
LAB_002e05ca:
  Abc_NtkDelete(pAVar3);
  return;
}

Assistant:

void Io_WriteHie( Abc_Ntk_t * pNtk, char * pBaseName, char * pFileName )
{
    Abc_Ntk_t * pNtkTemp, * pNtkResult, * pNtkBase = NULL;
    int i;
    // check if the current network is available
    if ( pNtk == NULL )
    {
        fprintf( stdout, "Empty network.\n" );
        return;
    }

    // read the base network
    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk) );
    if ( Io_ReadFileType(pBaseName) == IO_FILE_BLIF )
        pNtkBase = Io_ReadBlifMv( pBaseName, 0, 1 );
    else if ( Io_ReadFileType(pBaseName) == IO_FILE_BLIFMV )
        pNtkBase = Io_ReadBlifMv( pBaseName, 1, 1 );
    else if ( Io_ReadFileType(pBaseName) == IO_FILE_VERILOG )
        pNtkBase = Io_ReadVerilog( pBaseName, 1 );
    else 
        fprintf( stderr, "Unknown input file format.\n" );
    if ( pNtkBase == NULL )
        return;

    // flatten logic hierarchy if present
    if ( Abc_NtkWhiteboxNum(pNtkBase) > 0 && pNtk->nBarBufs == 0 )
    {
        pNtkBase = Abc_NtkFlattenLogicHierarchy( pNtkTemp = pNtkBase );
        Abc_NtkDelete( pNtkTemp );
        if ( pNtkBase == NULL )
            return;
    }

    // reintroduce the boxes into the netlist
    if ( pNtk->nBarBufs > 0 )
    {
        // derive the netlist
        pNtkResult = Abc_NtkToNetlist( pNtk );
        pNtkResult = Abc_NtkFromBarBufs( pNtkBase, pNtkTemp = pNtkResult );
        Abc_NtkDelete( pNtkTemp );
        if ( pNtkResult )
            printf( "Hierarchy writer replaced %d barbufs by hierarchy boundaries.\n", pNtk->nBarBufs );
    }
    else if ( Io_ReadFileType(pBaseName) == IO_FILE_BLIFMV ) 
    {
        if ( Abc_NtkBlackboxNum(pNtkBase) > 0 )
        {
            printf( "Hierarchy writer does not support BLIF-MV with blackboxes.\n" );
            Abc_NtkDelete( pNtkBase );
            return;
        }
        // convert the current network to BLIF-MV
        assert( !Abc_NtkIsNetlist(pNtk) );
        pNtkResult = Abc_NtkToNetlist( pNtk );
        if ( !Abc_NtkConvertToBlifMv( pNtkResult ) )
        {
            Abc_NtkDelete( pNtkBase );
            return;
        }
        // reintroduce the network
        pNtkResult = Abc_NtkInsertBlifMv( pNtkBase, pNtkTemp = pNtkResult );
        Abc_NtkDelete( pNtkTemp );
    }
    else if ( Abc_NtkBlackboxNum(pNtkBase) > 0 )
    {
        // derive the netlist
        pNtkResult = Abc_NtkToNetlist( pNtk );
        pNtkResult = Abc_NtkInsertNewLogic( pNtkBase, pNtkTemp = pNtkResult );
        Abc_NtkDelete( pNtkTemp );
        if ( pNtkResult )
            printf( "Hierarchy writer reintroduced %d instances of blackboxes.\n", Abc_NtkBlackboxNum(pNtkBase) );
    }
    else
    {
        printf( "Warning: The output network does not contain blackboxes.\n" );
        pNtkResult = Abc_NtkToNetlist( pNtk );
    }
    Abc_NtkDelete( pNtkBase );
    if ( pNtkResult == NULL )
        return;

    // write the resulting network
    if ( Io_ReadFileType(pFileName) == IO_FILE_BLIF )
    {
        if ( pNtkResult->pDesign )
        {
            Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkResult->pDesign->vModules, pNtkTemp, i )
                if ( !Abc_NtkHasSop(pNtkTemp) && !Abc_NtkHasMapping(pNtkTemp) )
                    Abc_NtkToSop( pNtkTemp, -1, ABC_INFINITY );
        }
        else
        {
            if ( !Abc_NtkHasSop(pNtkResult) && !Abc_NtkHasMapping(pNtkResult) )
                Abc_NtkToSop( pNtkResult, -1, ABC_INFINITY );
        }
        Io_WriteBlif( pNtkResult, pFileName, 1, 0, 0 );
    }
    else if ( Io_ReadFileType(pFileName) == IO_FILE_VERILOG )
    {
        if ( pNtkResult->pDesign )
        {
            Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkResult->pDesign->vModules, pNtkTemp, i )
                if ( !Abc_NtkHasAig(pNtkTemp) && !Abc_NtkHasMapping(pNtkTemp) )
                    Abc_NtkToAig( pNtkTemp );
        }
        else
        {
            if ( !Abc_NtkHasAig(pNtkResult) && !Abc_NtkHasMapping(pNtkResult) )
                Abc_NtkToAig( pNtkResult );
        }
        Io_WriteVerilog( pNtkResult, pFileName, 0 );
    }
    else if ( Io_ReadFileType(pFileName) == IO_FILE_BLIFMV )
    {
        Io_WriteBlifMv( pNtkResult, pFileName );
    }
    else 
        fprintf( stderr, "Unknown output file format.\n" );

    Abc_NtkDelete( pNtkResult );
}